

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

bool __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert_update(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                   *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
                  time_point now,time_point expire_time,allow a)

{
  iterator keyed_position;
  
  keyed_position =
       std::
       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       ::find(&(this->m_keyed_elements)._M_h,key);
  if (keyed_position.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    if ((a & insert) == 0) {
      return false;
    }
    do_insert(this,key,value,now,expire_time);
  }
  else {
    if (((a & update) == 0) &&
       (((a & insert) == 0 ||
        ((long)now.__d.__r <
         (this->m_elements).
         super__Vector_base<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
         ._M_impl.super__Vector_impl_data._M_start
         [*(long *)((long)keyed_position.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x28)].m_expire_time.__d.__r)))) {
      return false;
    }
    do_update(this,(keyed_iterator)
                   keyed_position.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                   ._M_cur,value,expire_time);
  }
  return true;
}

Assistant:

auto do_insert_update(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time,
        allow                                 a) -> bool
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value), expire_time);
                return true;
            }
            else if (insert_allowed(a))
            {
                // If the item has expired and this is INSERT then allow the
                // insert to proceed, this can just be an update in place.
                const auto& [k, element_idx] = *keyed_position;
                element& e                   = m_elements[element_idx];
                if (now >= e.m_expire_time)
                {
                    do_update(keyed_position, std::move(value), expire_time);
                    return true;
                }
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value), now, expire_time);
                return true;
            }
        }
        return false;
    }